

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::select_multiple::load(select_multiple *this,context *context)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  base_widget *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  uint i;
  const_iterator p;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  range;
  base_widget *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  iterator in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff20;
  request *in_stack_ffffffffffffff38;
  _Self local_b0;
  _Self local_a8;
  uint local_9c;
  _Base_ptr local_98;
  undefined1 local_90;
  _Self local_88 [9];
  string local_40 [32];
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  
  base_widget::pre_load
            ((base_widget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (context *)in_stack_fffffffffffffef8);
  base_widget::set(in_RDI,true);
  http::context::request((context *)0x3fb03d);
  http::request::post_or_get_abi_cxx11_(in_stack_ffffffffffffff38);
  base_widget::name_abi_cxx11_(in_stack_fffffffffffffef8);
  local_20 = std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           (key_type *)in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_40);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x3fb0b0);
  local_88[0]._M_node = local_20.first._M_node;
  while( true ) {
    bVar1 = std::operator!=(local_88,&local_20.second);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x3fb0ef);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffff20._M_node,
                     (value_type *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    in_stack_ffffffffffffff20 = pVar5.first._M_node;
    in_stack_ffffffffffffff1f = pVar5.second;
    local_98 = in_stack_ffffffffffffff20._M_node;
    local_90 = in_stack_ffffffffffffff1f;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  }
  local_9c = 0;
  while( true ) {
    uVar2 = (ulong)local_9c;
    sVar3 = std::
            vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
            ::size((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                    *)&in_RDI[1].id_);
    if (sVar3 <= uVar2) break;
    std::
    vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
    ::operator[]((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                  *)&in_RDI[1].id_,(ulong)local_9c);
    in_stack_ffffffffffffff08 =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(in_stack_ffffffffffffff08._M_node,
                (key_type *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    local_a8._M_node = in_stack_ffffffffffffff08._M_node;
    local_b0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffef8);
    bVar1 = std::operator!=(&local_a8,&local_b0);
    in_stack_ffffffffffffff04 = (uint)bVar1;
    pvVar4 = std::
             vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
             ::operator[]((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                           *)&in_RDI[1].id_,(ulong)local_9c);
    *(uint *)pvVar4 = *(uint *)pvVar4 & 0xfffffffe | in_stack_ffffffffffffff04 & 1;
    local_9c = local_9c + 1;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x3fb258);
  return;
}

Assistant:

void select_multiple::load(http::context &context)
{
	pre_load(context);
	set(true);
	std::pair<http::request::form_type::const_iterator,http::request::form_type::const_iterator> 
		range=context.request().post_or_get().equal_range(name());
	std::set<std::string> keys;
	for(http::request::form_type::const_iterator p=range.first;p!=range.second;++p)
		keys.insert(p->second);
	for(unsigned i=0;i<elements_.size();i++) {
		elements_[i].selected= keys.find(elements_[i].id) != keys.end();
	}
}